

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall.cpp
# Opt level: O2

void sys_faccessat(Process *proc,Args *args)

{
  uint64_t uVar1;
  path path;
  path local_80;
  path local_60;
  string local_40;
  
  uVar1 = args->Arg[0];
  ReadString_abi_cxx11_(&local_40,(pid_t)args->PID,args->Arg[1]);
  std::__cxx11::string::string((string *)&local_80,(string *)&local_40);
  Process::Normalise(&local_60,proc,(int)uVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  if (-1 < args->Return) {
    Process::AddInput(proc,&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

static void sys_faccessat(Process *proc, const Args &args)
{
  const int fd = args[0];
  const fs::path path = proc->Normalise(fd, ReadString(args.PID, args[1]));

  if (args.Return >= 0) {
    proc->AddInput(path);
  }
}